

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O2

int Abc_NtkFxPerform(Abc_Ntk_t *pNtk,int nNewNodesMax,int LitCountMax,int fCanonDivs,int fVerbose,
                    int fVeryVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Wec_t *vCubes;
  char *__s;
  
  if ((pNtk->ntkFunc == ABC_FUNC_SOP) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    iVar1 = Abc_NtkFxCheck(pNtk);
    if (iVar1 == 0) {
      iVar1 = 0;
      __s = "Abc_NtkFastExtract: Nodes have duplicated fanins. FX is not performed.";
    }
    else {
      Abc_NtkCleanup(pNtk,0);
      Abc_NtkMakeLegit(pNtk);
      vCubes = Abc_NtkFxRetrieve(pNtk);
      Fx_FastExtract(vCubes,pNtk->vObjs->nSize,nNewNodesMax,LitCountMax,fCanonDivs,fVerbose,
                     fVeryVerbose);
      Abc_NtkFxInsert(pNtk,vCubes);
      Vec_WecFree(vCubes);
      iVar2 = Abc_NtkCheck(pNtk);
      iVar1 = 1;
      if (iVar2 != 0) {
        return 1;
      }
      __s = "Abc_NtkFxPerform: The network check has failed.";
    }
    puts(__s);
    return iVar1;
  }
  __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                ,0x134,"int Abc_NtkFxPerform(Abc_Ntk_t *, int, int, int, int, int)");
}

Assistant:

int Abc_NtkFxPerform( Abc_Ntk_t * pNtk, int nNewNodesMax, int LitCountMax, int fCanonDivs, int fVerbose, int fVeryVerbose )
{
    extern int Fx_FastExtract( Vec_Wec_t * vCubes, int ObjIdMax, int nNewNodesMax, int LitCountMax, int fCanonDivs, int fVerbose, int fVeryVerbose );
    Vec_Wec_t * vCubes;
    assert( Abc_NtkIsSopLogic(pNtk) );
    // check unique fanins
    if ( !Abc_NtkFxCheck(pNtk) )
    {
        printf( "Abc_NtkFastExtract: Nodes have duplicated fanins. FX is not performed.\n" );
        return 0;
    }
    // sweep removes useless nodes
    Abc_NtkCleanup( pNtk, 0 );
//    Abc_NtkOrderFanins( pNtk );
    // makes sure the SOPs are SCC-free and D1C-free
    Abc_NtkMakeLegit( pNtk );
    // collect information about the covers
    vCubes = Abc_NtkFxRetrieve( pNtk );
    // call the fast extract procedure
    if ( Fx_FastExtract( vCubes, Abc_NtkObjNumMax(pNtk), nNewNodesMax, LitCountMax, fCanonDivs, fVerbose, fVeryVerbose ) > 0 )
    {
        // update the network
        Abc_NtkFxInsert( pNtk, vCubes );
        Vec_WecFree( vCubes );
        if ( !Abc_NtkCheck( pNtk ) )
            printf( "Abc_NtkFxPerform: The network check has failed.\n" );
        return 1;
    }
    else
        printf( "Warning: The network has not been changed by \"fx\".\n" );
    Vec_WecFree( vCubes );
    return 0;
}